

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O3

void __thiscall lsim::ModelWire::add_segments(ModelWire *this,Point *anchors,size_t num_anchors)

{
  long lVar1;
  Point *p1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (1 < num_anchors) {
    lVar1 = num_anchors - 1;
    p1 = anchors + 1;
    do {
      fVar2 = ABS(p1[-1].x);
      fVar3 = ABS(p1->x);
      fVar4 = fVar3;
      if (fVar3 <= fVar2) {
        fVar4 = fVar2;
      }
      if ((float)(~-(uint)NAN(fVar2) & (uint)fVar4 | -(uint)NAN(fVar2) & (uint)fVar3) *
          1.1920929e-07 < ABS(p1[-1].x - p1->x)) {
LAB_0010f0f7:
        add_segment(this,p1 + -1,p1);
      }
      else {
        fVar2 = ABS(p1[-1].y);
        fVar3 = ABS(p1->y);
        fVar4 = fVar3;
        if (fVar3 <= fVar2) {
          fVar4 = fVar2;
        }
        if ((float)(~-(uint)NAN(fVar2) & (uint)fVar4 | -(uint)NAN(fVar2) & (uint)fVar3) *
            1.1920929e-07 < ABS(p1[-1].y - p1->y)) goto LAB_0010f0f7;
      }
      p1 = p1 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void ModelWire::add_segments(Point *anchors, size_t num_anchors) {
    for(size_t a = 1;a < num_anchors; ++a) {
        if (anchors[a - 1] != anchors[a]) {
            add_segment(anchors[a - 1], anchors[a]);
        }
    }
}